

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btConvexTriangleCallback::btConvexTriangleCallback
          (btConvexTriangleCallback *this,btDispatcher *dispatcher,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  int iVar1;
  undefined4 extraout_var;
  btCollisionObjectWrapper *pbVar2;
  undefined3 in_register_00000081;
  bool bVar3;
  
  (this->super_btTriangleCallback)._vptr_btTriangleCallback =
       (_func_int **)&PTR__btConvexTriangleCallback_0021c1a0;
  this->m_dispatcher = dispatcher;
  bVar3 = CONCAT31(in_register_00000081,isSwapped) != 0;
  pbVar2 = body0Wrap;
  if (bVar3) {
    pbVar2 = body1Wrap;
  }
  this->m_dispatchInfoPtr = (btDispatcherInfo *)0x0;
  this->m_convexBodyWrap = pbVar2;
  if (bVar3) {
    body1Wrap = body0Wrap;
  }
  this->m_triBodyWrap = body1Wrap;
  iVar1 = (*dispatcher->_vptr_btDispatcher[3])
                    (dispatcher,pbVar2->m_collisionObject,body1Wrap->m_collisionObject);
  this->m_manifoldPtr = (btPersistentManifold *)CONCAT44(extraout_var,iVar1);
  (*this->m_dispatcher->_vptr_btDispatcher[5])
            (this->m_dispatcher,(btPersistentManifold *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

btConvexTriangleCallback::btConvexTriangleCallback(btDispatcher*  dispatcher,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,bool isSwapped):
	  m_dispatcher(dispatcher),
	m_dispatchInfoPtr(0)
{
	m_convexBodyWrap = isSwapped? body1Wrap:body0Wrap;
	m_triBodyWrap = isSwapped? body0Wrap:body1Wrap;
	
	  //
	  // create the manifold from the dispatcher 'manifold pool'
	  //
	  m_manifoldPtr = m_dispatcher->getNewManifold(m_convexBodyWrap->getCollisionObject(),m_triBodyWrap->getCollisionObject());

  	  clearCache();
}